

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O3

void dfsTraversal_CLG(ClgGraph clgGraph)

{
  long lVar1;
  int i;
  long lVar2;
  _Bool *visited;
  ulong __n;
  code *pcStack_30;
  
  if (clgGraph != (ClgGraph)0x0) {
    __n = (ulong)(uint)clgGraph->vertexSize;
    lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
    visited = (_Bool *)(&stack0xffffffffffffffd8 + lVar1);
    if (0 < clgGraph->vertexSize) {
      lVar2 = 0;
      *(undefined8 *)((long)&pcStack_30 + lVar1) = 0x10ac30;
      memset(visited,0,__n);
      do {
        if (visited[lVar2] == false) {
          *(undefined8 *)((long)&pcStack_30 + lVar1) = 0x10ac45;
          dfs_CLG(clgGraph,visited,(int)lVar2);
          __n = (ulong)(uint)clgGraph->vertexSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < (int)__n);
    }
    fwrite(anon_var_dwarf_6204 + 0x42,2,1,_stdout);
    return;
  }
  pcStack_30 = dfs_CLG;
  __assert_fail("clgGraph",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/cross_list_graph.c"
                ,0x126,"void dfsTraversal_CLG(ClgGraph)");
}

Assistant:

void dfsTraversal_CLG(ClgGraph clgGraph) {
    assert(clgGraph);
    bool visited[clgGraph->vertexSize];

    for (int i = 0; i < clgGraph->vertexSize; ++i)
        visited[i] = false;

    for (int i = 0; i < clgGraph->vertexSize; ++i) {
        if (visited[i]) continue;
        dfs_CLG(clgGraph, visited, i);
    }
    fprintf(stdout, "\n\n");
}